

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O3

void __thiscall
QGraphicsProxyWidget::wheelEvent(QGraphicsProxyWidget *this,QGraphicsSceneWheelEvent *event)

{
  QGraphicsProxyWidgetPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  ScrollPhase SVar3;
  Orientation OVar4;
  uint uVar5;
  MouseButtons MVar6;
  KeyboardModifiers KVar7;
  QWidget *pQVar8;
  Data *pDVar9;
  QPoint QVar10;
  undefined8 uVar11;
  int *piVar12;
  int *piVar13;
  QWidget *pQVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  double dVar16;
  QPointF QVar17;
  QArrayData *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  double local_d8;
  double local_d0;
  QWheelEvent wheelEvent;
  QWeakPointer<QObject> local_58;
  QPointF local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsProxyWidgetPrivate **)(this + 0x18);
  pDVar9 = (this_00->widget).wp.d;
  if (((pDVar9 == (Data *)0x0) || (*(int *)(pDVar9 + 4) == 0)) ||
     ((this_00->widget).wp.value == (QObject *)0x0)) goto LAB_005fb8a2;
  QVar17 = QGraphicsSceneWheelEvent::pos(event);
  local_48.yp = QVar17.yp;
  local_48.xp = QVar17.xp;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  dVar16 = (double)((ulong)local_48.xp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.xp;
  bVar2 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  _wheelEvent = (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar16);
  dVar16 = (double)((ulong)local_48.yp & 0x8000000000000000 | 0x3fe0000000000000) + local_48.yp;
  bVar2 = 2147483647.0 < dVar16;
  if (dVar16 <= -2147483648.0) {
    dVar16 = -2147483648.0;
  }
  register0x00000004 =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar16);
  pQVar8 = QWidget::childAt((QWidget *)(this_00->widget).wp.value,(QPoint *)&wheelEvent);
  if (pQVar8 == (QWidget *)0x0) {
    local_58.d = (Data *)0x0;
LAB_005fb53d:
    pDVar9 = (Data *)0x0;
LAB_005fb53f:
    pDVar1 = (this_00->widget).wp.d;
    local_58.value = (this_00->widget).wp.value;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar1 = *(int *)pDVar1 + 1;
      UNLOCK();
      pDVar9 = local_58.d;
    }
    local_58.d = pDVar1;
    if (pDVar9 != (Data *)0x0) {
      LOCK();
      *(int *)pDVar9 = *(int *)pDVar9 + -1;
      UNLOCK();
      if (*(int *)pDVar9 == 0) {
        operator_delete(pDVar9);
      }
    }
  }
  else {
    pDVar9 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
    local_58.d = pDVar9;
    if (pDVar9 == (Data *)0x0) goto LAB_005fb53d;
    local_58.value = &pQVar8->super_QObject;
    if (*(int *)(pDVar9 + 4) == 0) goto LAB_005fb53f;
  }
  pDVar9 = QApplicationPrivate::wheel_widget.wp.d;
  if (QApplicationPrivate::wheel_widget.wp.d != (Data *)0x0) {
    LOCK();
    *(int *)QApplicationPrivate::wheel_widget.wp.d =
         *(int *)QApplicationPrivate::wheel_widget.wp.d + 1;
    UNLOCK();
  }
  SVar3 = QGraphicsSceneWheelEvent::phase(event);
  if (SVar3 == ScrollBegin) {
    QWeakPointer<QObject>::operator=(&QApplicationPrivate::wheel_widget.wp,&local_58);
LAB_005fb61a:
    if ((local_58.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    QVar17 = QGraphicsProxyWidgetPrivate::mapToReceiver(this_00,&local_48,pQVar8);
    local_48.yp = QVar17.yp;
    local_48.xp = QVar17.xp;
    OVar4 = QGraphicsSceneWheelEvent::orientation(event);
    uVar5 = QGraphicsSceneWheelEvent::delta(event);
    uVar15 = (ulong)uVar5 << 0x20;
    if (OVar4 == Horizontal) {
      uVar15 = (ulong)uVar5;
    }
    _wheelEvent = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
    QVar10 = QGraphicsSceneWheelEvent::screenPos(event);
    local_d8 = (double)QVar10.xp.m_i.m_i;
    local_d0 = (double)QVar10.yp.m_i.m_i;
    QVar10 = QGraphicsSceneWheelEvent::pixelDelta(event);
    MVar6 = QGraphicsSceneWheelEvent::buttons(event);
    KVar7 = QGraphicsSceneWheelEvent::modifiers(event);
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    bVar2 = QGraphicsSceneWheelEvent::isInverted(event);
    local_f8 = (QArrayData *)0x0;
    uStack_f0 = 0;
    local_e8 = 0;
    uVar11 = QPointingDevice::primaryPointingDevice((QString *)&local_f8);
    QWheelEvent::QWheelEvent
              (&wheelEvent,&local_48,&local_d8,QVar10,uVar15,
               MVar6.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i,
               KVar7.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i,SVar3,bVar2,2,uVar11);
    if (local_f8 != (QArrayData *)0x0) {
      LOCK();
      (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_f8,2,0x10);
      }
    }
    pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
    if (pQVar8 == (QWidget *)0x0) {
      piVar12 = (int *)0x0;
    }
    else {
      piVar12 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
    }
    if ((local_58.d == (Data *)0x0) ||
       (pQVar14 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    qt_sendSpontaneousEvent(&pQVar14->super_QObject,(QEvent *)&wheelEvent);
    (**(code **)(*(long *)&event->super_QGraphicsSceneEvent + 0x10))(event,0xaa);
    QGraphicsSceneWheelEvent::phase(event);
    if (piVar12 != (int *)0x0) {
      if (((pQVar8 != (QWidget *)0x0) && (piVar12[1] != 0)) &&
         (bVar2 = QWidget::hasFocus(pQVar8), !bVar2)) {
        QWidget::update(pQVar8);
        pQVar8 = QWidget::focusWidget((QWidget *)(this_00->widget).wp.value);
        if (pQVar8 == (QWidget *)0x0) {
          piVar13 = (int *)0x0;
        }
        else {
          piVar13 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
        }
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          operator_delete(piVar12);
        }
        if (piVar13 == (int *)0x0) goto LAB_005fb84c;
        piVar12 = piVar13;
        if (((pQVar8 != (QWidget *)0x0) && (piVar13[1] != 0)) &&
           (bVar2 = QWidget::hasFocus(pQVar8), bVar2)) {
          QWidget::update(pQVar8);
        }
      }
      LOCK();
      *piVar12 = *piVar12 + -1;
      UNLOCK();
      if (*piVar12 == 0) {
        operator_delete(piVar12);
      }
    }
LAB_005fb84c:
    QWheelEvent::~QWheelEvent(&wheelEvent);
  }
  else {
    SVar3 = QGraphicsSceneWheelEvent::phase(event);
    if (SVar3 == NoScrollPhase) goto LAB_005fb61a;
    if ((QApplicationPrivate::wheel_widget.wp.d == (Data *)0x0) ||
       (pQVar8 = (QWidget *)QApplicationPrivate::wheel_widget.wp.value,
       *(int *)(QApplicationPrivate::wheel_widget.wp.d + 4) == 0)) {
      pQVar8 = (QWidget *)0x0;
    }
    if ((local_58.d == (Data *)0x0) ||
       (pQVar14 = (QWidget *)local_58.value, *(int *)(local_58.d + 4) == 0)) {
      pQVar14 = (QWidget *)0x0;
    }
    if (pQVar8 == pQVar14) goto LAB_005fb61a;
    (event->super_QGraphicsSceneEvent).field_0xc = 0;
  }
  if (pDVar9 != (Data *)0x0) {
    LOCK();
    *(int *)pDVar9 = *(int *)pDVar9 + -1;
    UNLOCK();
    if (*(int *)pDVar9 == 0) {
      if (pDVar9 == (Data *)0x0) {
        pDVar9 = (Data *)0x0;
      }
      operator_delete(pDVar9);
    }
  }
  if (local_58.d != (Data *)0x0) {
    LOCK();
    *(int *)local_58.d = *(int *)local_58.d + -1;
    UNLOCK();
    if (*(int *)local_58.d == 0) {
      pDVar9 = local_58.d;
      if (local_58.d == (Data *)0x0) {
        pDVar9 = (Data *)0x0;
      }
      operator_delete(pDVar9);
    }
  }
LAB_005fb8a2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsProxyWidget::wheelEvent(QGraphicsSceneWheelEvent *event)
{
    Q_D(QGraphicsProxyWidget);
#ifdef GRAPHICSPROXYWIDGET_DEBUG
    qDebug("QGraphicsProxyWidget::wheelEvent");
#endif
    if (!d->widget)
        return;

    QPointF pos = event->pos();
    QPointer<QWidget> receiver = d->widget->childAt(pos.toPoint());
    if (!receiver)
        receiver = d->widget;

    // high precision event streams go to the grabber, which will be the
    // QGraphicsView's viewport. We need to change that temporarily, otherwise
    // the event we send to the receiver get grabbed by the viewport, resulting
    // in infinite recursion
    QPointer<QWidget> prev_grabber = QApplicationPrivate::wheel_widget;
    if (event->phase() == Qt::ScrollBegin) {
        QApplicationPrivate::wheel_widget = receiver;
    } else if (event->phase() != Qt::NoScrollPhase && QApplicationPrivate::wheel_widget != receiver) {
        // this event is part of a stream that didn't start here, so ignore
        event->ignore();
        return;
    }

    // Map event position from us to the receiver
    pos = d->mapToReceiver(pos, receiver);

    // Send mouse event.
    QPoint angleDelta;
    if (event->orientation() == Qt::Horizontal)
        angleDelta.setX(event->delta());
    else
        angleDelta.setY(event->delta());
    // pixelDelta, inverted, scrollPhase and source from the original QWheelEvent
    // were not preserved in the QGraphicsSceneWheelEvent unfortunately
    QWheelEvent wheelEvent(pos, event->screenPos(), event->pixelDelta(), angleDelta,
                           event->buttons(), event->modifiers(), event->phase(),
                           event->isInverted(), Qt::MouseEventSynthesizedByQt,
                           QPointingDevice::primaryPointingDevice());
    QPointer<QWidget> focusWidget = d->widget->focusWidget();
    extern bool qt_sendSpontaneousEvent(QObject *, QEvent *);
    qt_sendSpontaneousEvent(receiver, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());

    if (event->phase() == Qt::ScrollBegin) {
        // reset the wheel grabber if the event wasn't accepted
        if (!wheelEvent.isAccepted())
            QApplicationPrivate::wheel_widget = prev_grabber;
    }

    // ### Remove, this should be done by proper focusIn/focusOut events.
    if (focusWidget && !focusWidget->hasFocus()) {
        focusWidget->update();
        focusWidget = d->widget->focusWidget();
        if (focusWidget && focusWidget->hasFocus())
            focusWidget->update();
    }
}